

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsRead(sqlite3_file *pFile,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *psVar1;
  u32 uVar2;
  u8 *pBuf;
  u32 iRoot;
  u8 *aBuf;
  sqlite3_file *pFd;
  int rc;
  sqlite3rbu *pRbu;
  rbu_file *p;
  sqlite_int64 iOfst_local;
  int iAmt_local;
  void *zBuf_local;
  sqlite3_file *pFile_local;
  
  psVar1 = pFile[3].pMethods;
  if ((psVar1 == (sqlite3_io_methods *)0x0) || (psVar1->iVersion != 3)) {
    if ((psVar1 == (sqlite3_io_methods *)0x0) ||
       (((psVar1->iVersion != 1 || (((ulong)pFile[5].pMethods & 0x80000) == 0)) ||
        (iOfst < (long)psVar1[1].xShmBarrier)))) {
      pFd._4_4_ = (**(code **)(*(long *)pFile[1].pMethods + 0x10))
                            (pFile[1].pMethods,zBuf,iAmt,iOfst);
      if (((((psVar1 != (sqlite3_io_methods *)0x0) &&
            (psVar1->xWrite == (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0)) &&
           (pFd._4_4_ == 0x20a)) && ((iOfst == 0 && (((ulong)pFile[5].pMethods & 0x100) != 0)))) &&
         ((*(int *)&psVar1->xLock == 0 &&
          (pFd._4_4_ = (**(code **)(*(long *)psVar1[2].xLock + 0x10))(psVar1[2].xLock,zBuf,iAmt,0),
          pFd._4_4_ == 0)))) {
        uVar2 = rbuGetU32((u8 *)((long)zBuf + 0x34));
        rbuPutU32((u8 *)((long)zBuf + 0x34),(uint)(uVar2 != 0));
        rbuPutU32((u8 *)((long)zBuf + 0x24),0);
        rbuPutU32((u8 *)((long)zBuf + 0x20),0);
        rbuPutU32((u8 *)((long)zBuf + 0x1c),1);
        rbuPutU32((u8 *)((long)zBuf + 0x18),*(int *)(psVar1[2].xLock + 0x2c) + 1);
        if (100 < iAmt) {
          memset((void *)((long)zBuf + 100),0,(long)(iAmt + -100));
          rbuPutU16((u8 *)((long)zBuf + 0x69),(u16)iAmt);
          *(undefined1 *)((long)zBuf + 100) = 0xd;
        }
      }
    }
    else {
      pFd._4_4_ = 0;
      memset(zBuf,0,(long)iAmt);
    }
    if (((pFd._4_4_ == 0) && (iOfst == 0)) && (((ulong)pFile[5].pMethods & 0x100) != 0)) {
      uVar2 = rbuGetU32((u8 *)((long)zBuf + 0x18));
      *(u32 *)((long)&pFile[5].pMethods + 4) = uVar2;
      *(undefined1 *)&pFile[6].pMethods = *(undefined1 *)((long)zBuf + 0x13);
    }
  }
  else {
    pFd._4_4_ = rbuCaptureWalRead((sqlite3rbu *)pFile[3].pMethods,iOfst,iAmt);
  }
  return pFd._4_4_;
}

Assistant:

static int rbuVfsRead(
  sqlite3_file *pFile, 
  void *zBuf, 
  int iAmt, 
  sqlite_int64 iOfst
){
  rbu_file *p = (rbu_file*)pFile;
  sqlite3rbu *pRbu = p->pRbu;
  int rc;

  if( pRbu && pRbu->eStage==RBU_STAGE_CAPTURE ){
    assert( p->openFlags & SQLITE_OPEN_WAL );
    rc = rbuCaptureWalRead(p->pRbu, iOfst, iAmt);
  }else{
    if( pRbu && pRbu->eStage==RBU_STAGE_OAL 
     && (p->openFlags & SQLITE_OPEN_WAL) 
     && iOfst>=pRbu->iOalSz 
    ){
      rc = SQLITE_OK;
      memset(zBuf, 0, iAmt);
    }else{
      rc = p->pReal->pMethods->xRead(p->pReal, zBuf, iAmt, iOfst);
#if 1
      /* If this is being called to read the first page of the target 
      ** database as part of an rbu vacuum operation, synthesize the 
      ** contents of the first page if it does not yet exist. Otherwise,
      ** SQLite will not check for a *-wal file.  */
      if( pRbu && rbuIsVacuum(pRbu) 
          && rc==SQLITE_IOERR_SHORT_READ && iOfst==0
          && (p->openFlags & SQLITE_OPEN_MAIN_DB)
          && pRbu->rc==SQLITE_OK
      ){
        sqlite3_file *pFd = (sqlite3_file*)pRbu->pRbuFd;
        rc = pFd->pMethods->xRead(pFd, zBuf, iAmt, iOfst);
        if( rc==SQLITE_OK ){
          u8 *aBuf = (u8*)zBuf;
          u32 iRoot = rbuGetU32(&aBuf[52]) ? 1 : 0;
          rbuPutU32(&aBuf[52], iRoot);      /* largest root page number */
          rbuPutU32(&aBuf[36], 0);          /* number of free pages */
          rbuPutU32(&aBuf[32], 0);          /* first page on free list trunk */
          rbuPutU32(&aBuf[28], 1);          /* size of db file in pages */
          rbuPutU32(&aBuf[24], pRbu->pRbuFd->iCookie+1);  /* Change counter */

          if( iAmt>100 ){
            memset(&aBuf[100], 0, iAmt-100);
            rbuPutU16(&aBuf[105], iAmt & 0xFFFF);
            aBuf[100] = 0x0D;
          }
        }
      }
#endif
    }
    if( rc==SQLITE_OK && iOfst==0 && (p->openFlags & SQLITE_OPEN_MAIN_DB) ){
      /* These look like magic numbers. But they are stable, as they are part
       ** of the definition of the SQLite file format, which may not change. */
      u8 *pBuf = (u8*)zBuf;
      p->iCookie = rbuGetU32(&pBuf[24]);
      p->iWriteVer = pBuf[19];
    }
  }
  return rc;
}